

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

int32_t icu_63::ICU_Utility::parsePattern
                  (UnicodeString *pat,Replaceable *text,int32_t index,int32_t limit)

{
  UBool UVar1;
  int32_t iVar2;
  uint c_00;
  int iVar3;
  uint local_30;
  UChar32 c;
  UChar32 cpat;
  int32_t ipat;
  int32_t limit_local;
  int32_t index_local;
  Replaceable *text_local;
  UnicodeString *pat_local;
  
  c = 0;
  iVar2 = UnicodeString::length(pat);
  if (iVar2 == 0) {
    return index;
  }
  local_30 = UnicodeString::char32At(pat,0);
  ipat = index;
  do {
    while( true ) {
      if (limit <= ipat) {
        return -1;
      }
      c_00 = Replaceable::char32At(text,ipat);
      if (local_30 == 0x7e) break;
      if (c_00 != local_30) {
        return -1;
      }
      iVar3 = 2;
      if (c_00 < 0x10000) {
        iVar3 = 1;
      }
      ipat = iVar3 + ipat;
      iVar3 = 2;
      if (local_30 < 0x10000) {
        iVar3 = 1;
      }
      c = iVar3 + c;
      iVar2 = UnicodeString::length(pat);
      if (c == iVar2) {
        return ipat;
      }
LAB_003b2794:
      local_30 = UnicodeString::char32At(pat,c);
    }
    UVar1 = PatternProps::isWhiteSpace(c_00);
    if (UVar1 == '\0') {
      c = c + 1;
      iVar2 = UnicodeString::length(pat);
      if (c == iVar2) {
        return ipat;
      }
      goto LAB_003b2794;
    }
    iVar3 = 2;
    if (c_00 < 0x10000) {
      iVar3 = 1;
    }
    ipat = iVar3 + ipat;
  } while( true );
}

Assistant:

int32_t ICU_Utility::parsePattern(const UnicodeString& pat,
                                  const Replaceable& text,
                                  int32_t index,
                                  int32_t limit) {
    int32_t ipat = 0;

    // empty pattern matches immediately
    if (ipat == pat.length()) {
        return index;
    }

    UChar32 cpat = pat.char32At(ipat);

    while (index < limit) {
        UChar32 c = text.char32At(index);

        // parse \s*
        if (cpat == 126 /*~*/) {
            if (PatternProps::isWhiteSpace(c)) {
                index += U16_LENGTH(c);
                continue;
            } else {
                if (++ipat == pat.length()) {
                    return index; // success; c unparsed
                }
                // fall thru; process c again with next cpat
            }
        }

        // parse literal
        else if (c == cpat) {
            index += U16_LENGTH(c);
            ipat += U16_LENGTH(cpat);
            if (ipat == pat.length()) {
                return index; // success; c parsed
            }
            // fall thru; get next cpat
        }

        // match failure of literal
        else {
            return -1;
        }

        cpat = pat.char32At(ipat);
    }

    return -1; // text ended before end of pat
}